

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O0

void HydroUtils::EB_ComputeDivergence
               (Box *bx,Array4<double> *div,Array4<const_double> *fx,Array4<const_double> *fy,
               Array4<const_double> *fz,Array4<const_double> *vfrac,int ncomp,Geometry *geom,
               Real mult,bool fluxes_are_area_weighted)

{
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  void *in_R8;
  void *in_R9;
  CoordSys *in_stack_00000010;
  byte in_stack_00000018;
  Real qvol;
  GpuArray<double,_3U> dxinv;
  undefined1 local_200 [56];
  anon_class_368_9_daa7aa1f *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  Box *in_stack_fffffffffffffe48;
  undefined1 auStack_168 [64];
  undefined1 auStack_128 [64];
  undefined1 auStack_e8 [64];
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  GpuArray<double,_3U> local_88;
  byte local_69;
  void *local_60;
  void *local_58;
  void *local_50;
  void *local_48;
  void *local_40;
  undefined4 local_2c;
  GpuArray<double,_3U> *local_28;
  undefined4 local_1c;
  GpuArray<double,_3U> *local_18;
  undefined4 local_c;
  GpuArray<double,_3U> *local_8;
  
  local_69 = in_stack_00000018 & 1;
  local_60 = in_R9;
  local_58 = in_R8;
  local_50 = in_RCX;
  local_48 = in_RDX;
  local_40 = in_RSI;
  amrex::CoordSys::InvCellSizeArray(&local_88,in_stack_00000010);
  local_8 = &local_88;
  local_c = 0;
  local_18 = &local_88;
  local_1c = 1;
  local_28 = &local_88;
  local_2c = 2;
  local_90 = local_88.arr[0] * local_88.arr[1] * local_88.arr[2];
  memcpy(local_200,local_60,0x3c);
  memcpy(&stack0xfffffffffffffe48,local_40,0x3c);
  memcpy(auStack_168,local_48,0x3c);
  memcpy(auStack_128,local_50,0x3c);
  memcpy(auStack_e8,local_58,0x3c);
  local_a8 = local_88.arr[0];
  local_a0 = local_88.arr[1];
  local_98 = local_88.arr[2];
  amrex::
  ParallelFor<int,HydroUtils::EB_ComputeDivergence(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,int,amrex::Geometry_const&,double,bool)::__0,void>
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,in_stack_fffffffffffffe38);
  return;
}

Assistant:

void
HydroUtils::EB_ComputeDivergence ( Box const& bx,
                                   Array4<Real> const& div,
                                   AMREX_D_DECL( Array4<Real const> const& fx,
                                                 Array4<Real const> const& fy,
                                                 Array4<Real const> const& fz),
                                   Array4<Real const> const& vfrac,
                                   const int ncomp, Geometry const& geom,
                                   const Real mult,
                                   const bool fluxes_are_area_weighted )
{
    const auto dxinv = geom.InvCellSizeArray();

#if (AMREX_SPACEDIM==3)
    Real qvol = dxinv[0] * dxinv[1] * dxinv[2];
#else
    Real qvol = dxinv[0] * dxinv[1];
#endif

    amrex::ParallelFor(bx, ncomp, [=]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if ( vfrac(i,j,k) > 0.)
        {
            if (fluxes_are_area_weighted)
                div(i,j,k,n) =  mult * qvol / vfrac(i,j,k) *
                    (
                             fx(i+1,j,k,n) -  fx(i,j,k,n)
                           + fy(i,j+1,k,n) -  fy(i,j,k,n)
#if (AMREX_SPACEDIM==3)
                           + fz(i,j,k+1,n) -  fz(i,j,k,n)
#endif
                    );
            else
                div(i,j,k,n) =  mult / vfrac(i,j,k) *
                    (
                             (fx(i+1,j,k,n) -  fx(i,j,k,n)) * dxinv[0]
                           + (fy(i,j+1,k,n) -  fy(i,j,k,n)) * dxinv[1]
#if (AMREX_SPACEDIM==3)
                           + (fz(i,j,k+1,n) -  fz(i,j,k,n)) * dxinv[2]
#endif
                    );
        }
        else
        {
            div(i,j,k,n) = 0.0;
        }

    });
}